

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_letTypeWithPrimitiveMacro
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t *value;
  sysbvm_tuple_t *type;
  sysbvm_tuple_t *name;
  sysbvm_tuple_t *macroContext;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 4) {
    sysbvm_error_argumentCountMismatch(4,argumentCount);
  }
  sVar1 = sysbvm_macroContext_getSourcePosition(*arguments);
  sVar1 = sysbvm_astVariableDefinitionNode_create
                    (context,sVar1,arguments[1],arguments[2],arguments[3],false);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_letTypeWithPrimitiveMacro(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 4) sysbvm_error_argumentCountMismatch(4, argumentCount);

    sysbvm_tuple_t *macroContext = &arguments[0];
    sysbvm_tuple_t *name = &arguments[1];
    sysbvm_tuple_t *type = &arguments[2];
    sysbvm_tuple_t *value = &arguments[3];

    sysbvm_tuple_t sourcePosition = sysbvm_macroContext_getSourcePosition(*macroContext);
    return sysbvm_astVariableDefinitionNode_create(context, sourcePosition, *name, *type, *value, false);
}